

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int TestRptrRegEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                       _func_int_uchar_ptr_x86Size_x86Reg_int_x86Reg_int_x86Reg *fun,uint testSize)

{
  x86Reg xVar1;
  x86Reg xVar2;
  x86Reg xVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  x86Reg *pxVar8;
  uchar *puVar9;
  long local_68;
  int local_48;
  
  local_68 = 0;
  puVar9 = stream;
  do {
    lVar7 = 0;
    do {
      pxVar8 = testBaseRegs;
      lVar6 = 0;
      do {
        if (((int)lVar6 != 0 || (int)lVar7 != 0) && (testSize & 1) != 0) {
          xVar1 = testIndexRegs[lVar7];
          xVar2 = *pxVar8;
          xVar3 = testRegs[local_68];
          EMIT_OP_RPTR_REG(ctx,op,sDWORD,xVar1,1,xVar2,0,xVar3);
          iVar4 = (*fun)(puVar9,sDWORD,xVar1,1,xVar2,0,xVar3);
          puVar9 = puVar9 + iVar4;
          EMIT_OP_RPTR_REG(ctx,op,sDWORD,xVar1,1,xVar2,4,xVar3);
          iVar4 = (*fun)(puVar9,sDWORD,xVar1,1,xVar2,4,xVar3);
          EMIT_OP_RPTR_REG(ctx,op,sDWORD,xVar1,1,xVar2,0x400,xVar3);
          iVar5 = (*fun)(puVar9 + iVar4,sDWORD,xVar1,1,xVar2,0x400,xVar3);
          puVar9 = puVar9 + iVar4 + iVar5;
          if (lVar7 != 0) {
            EMIT_OP_RPTR_REG(ctx,op,sDWORD,xVar1,2,xVar2,0,xVar3);
            iVar4 = (*fun)(puVar9,sDWORD,xVar1,2,xVar2,0,xVar3);
            puVar9 = puVar9 + iVar4;
            EMIT_OP_RPTR_REG(ctx,op,sDWORD,xVar1,2,xVar2,4,xVar3);
            iVar4 = (*fun)(puVar9,sDWORD,xVar1,2,xVar2,4,xVar3);
            EMIT_OP_RPTR_REG(ctx,op,sDWORD,xVar1,2,xVar2,0x400,xVar3);
            iVar5 = (*fun)(puVar9 + iVar4,sDWORD,xVar1,2,xVar2,0x400,xVar3);
            puVar9 = puVar9 + iVar4 + iVar5;
          }
        }
        if ((testSize & 2) != 0 && ((int)lVar6 != 0 || (int)lVar7 != 0)) {
          xVar1 = testIndexRegs[lVar7];
          xVar2 = *pxVar8;
          xVar3 = testRegs[local_68];
          EMIT_OP_RPTR_REG(ctx,op,sQWORD,xVar1,1,xVar2,0,xVar3);
          iVar4 = (*fun)(puVar9,sQWORD,xVar1,1,xVar2,0,xVar3);
          puVar9 = puVar9 + iVar4;
          EMIT_OP_RPTR_REG(ctx,op,sQWORD,xVar1,1,xVar2,4,xVar3);
          iVar4 = (*fun)(puVar9,sQWORD,xVar1,1,xVar2,4,xVar3);
          EMIT_OP_RPTR_REG(ctx,op,sQWORD,xVar1,1,xVar2,0x400,xVar3);
          iVar5 = (*fun)(puVar9 + iVar4,sQWORD,xVar1,1,xVar2,0x400,xVar3);
          puVar9 = puVar9 + iVar4 + iVar5;
          if (lVar7 != 0) {
            EMIT_OP_RPTR_REG(ctx,op,sQWORD,xVar1,2,xVar2,0,xVar3);
            iVar4 = (*fun)(puVar9,sQWORD,xVar1,2,xVar2,0,xVar3);
            puVar9 = puVar9 + iVar4;
            EMIT_OP_RPTR_REG(ctx,op,sQWORD,xVar1,2,xVar2,4,xVar3);
            iVar4 = (*fun)(puVar9,sQWORD,xVar1,2,xVar2,4,xVar3);
            EMIT_OP_RPTR_REG(ctx,op,sQWORD,xVar1,2,xVar2,0x400,xVar3);
            iVar5 = (*fun)(puVar9 + iVar4,sQWORD,xVar1,2,xVar2,0x400,xVar3);
            puVar9 = puVar9 + iVar4 + iVar5;
          }
        }
        lVar6 = lVar6 + 1;
        pxVar8 = pxVar8 + 1;
      } while (lVar6 != 10);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 9);
    local_68 = local_68 + 1;
  } while (local_68 != 9);
  local_48 = (int)stream;
  return (int)puVar9 - local_48;
}

Assistant:

int TestRptrRegEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, x86Reg src), unsigned testSize = testSizeDword | testSizeQword)
{
	unsigned char *start = stream;

	for(unsigned reg = 0; reg < sizeof(testRegs) / sizeof(testRegs[0]); reg++)
	{
		for(unsigned index = 0; index < sizeof(testIndexRegs) / sizeof(testIndexRegs[0]); index++)
		{
			for(unsigned base = 0; base < sizeof(testBaseRegs) / sizeof(testBaseRegs[0]); base++)
			{
				if(testSize & testSizeDword)
				{
					if(testIndexRegs[index] != rNONE || testBaseRegs[base] != rNONE)
					{
						EMIT_OP_RPTR_REG(ctx, op, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 0, testRegs[reg]);
						stream += fun(stream, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 0, testRegs[reg]);
						EMIT_OP_RPTR_REG(ctx, op, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 4, testRegs[reg]);
						stream += fun(stream, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 4, testRegs[reg]);
						EMIT_OP_RPTR_REG(ctx, op, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024, testRegs[reg]);
						stream += fun(stream, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024, testRegs[reg]);
					}

					if(testIndexRegs[index] != rNONE)
					{
						EMIT_OP_RPTR_REG(ctx, op, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 0, testRegs[reg]);
						stream += fun(stream, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 0, testRegs[reg]);
						EMIT_OP_RPTR_REG(ctx, op, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 4, testRegs[reg]);
						stream += fun(stream, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 4, testRegs[reg]);
						EMIT_OP_RPTR_REG(ctx, op, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024, testRegs[reg]);
						stream += fun(stream, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024, testRegs[reg]);
					}
				}

				if(testSize & testSizeQword)
				{
					// skip RDI-based addressing
					if(testIndexRegs[index] != rNONE || testBaseRegs[base] != rNONE)
					{
						EMIT_OP_RPTR_REG(ctx, op, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 0, testRegs[reg]);
						stream += fun(stream, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 0, testRegs[reg]);
						EMIT_OP_RPTR_REG(ctx, op, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 4, testRegs[reg]);
						stream += fun(stream, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 4, testRegs[reg]);
						EMIT_OP_RPTR_REG(ctx, op, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024, testRegs[reg]);
						stream += fun(stream, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024, testRegs[reg]);
					}

					if(testIndexRegs[index] != rNONE)
					{
						EMIT_OP_RPTR_REG(ctx, op, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 0, testRegs[reg]);
						stream += fun(stream, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 0, testRegs[reg]);
						EMIT_OP_RPTR_REG(ctx, op, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 4, testRegs[reg]);
						stream += fun(stream, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 4, testRegs[reg]);
						EMIT_OP_RPTR_REG(ctx, op, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024, testRegs[reg]);
						stream += fun(stream, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024, testRegs[reg]);
					}
				}
			}
		}
	}

	return int(stream - start);
}